

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O0

LogStream * __thiscall tt::LogStream::operator<<(LogStream *this,char *str)

{
  size_t len;
  char *str_local;
  LogStream *this_local;
  
  if (str == (char *)0x0) {
    detail::FixedBuffer<4000>::append(&this->m_buffer,"(null)",6);
  }
  else {
    len = strlen(str);
    detail::FixedBuffer<4000>::append(&this->m_buffer,str,len);
  }
  return this;
}

Assistant:

LogStream& operator<<(const char* str){
		if(str){
			m_buffer.append(str,strlen(str));
		}else{
			m_buffer.append("(null)",6);
		}

		return *this;
	}